

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void storeRGBA32FFromRGBA32F_sse4
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar12;
  float fVar13;
  undefined1 auVar10 [16];
  float fVar14;
  undefined1 auVar11 [16];
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 * 0x10 == uVar4) {
      return;
    }
    pfVar1 = (float *)((long)&src->r + uVar4);
    fVar5 = *pfVar1;
    fVar6 = pfVar1[1];
    fVar7 = pfVar1[2];
    fVar8 = pfVar1[3];
    if ((fVar8 != 1.0) || (NAN(fVar8))) {
      auVar10 = ZEXT816(0);
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        auVar2._4_4_ = fVar8;
        auVar2._0_4_ = fVar8;
        auVar2._8_4_ = fVar8;
        auVar2._12_4_ = fVar8;
        auVar10 = rcpps(auVar10,auVar2);
        fVar9 = auVar10._0_4_;
        fVar12 = auVar10._4_4_;
        fVar13 = auVar10._8_4_;
        fVar14 = auVar10._12_4_;
        auVar11._0_4_ = (fVar9 + fVar9) - fVar8 * fVar9 * fVar9;
        auVar11._4_4_ = (fVar12 + fVar12) - fVar8 * fVar12 * fVar12;
        auVar11._8_4_ = (fVar13 + fVar13) - fVar8 * fVar13 * fVar13;
        auVar11._12_4_ = (fVar14 + fVar14) - fVar8 * fVar14 * fVar14;
        auVar10 = insertps(auVar11,0x3f800000,0x30);
        fVar5 = fVar5 * auVar10._0_4_;
        fVar6 = fVar6 * auVar10._4_4_;
        fVar7 = fVar7 * auVar10._8_4_;
        fVar8 = fVar8 * auVar10._12_4_;
        goto LAB_00519c7b;
      }
    }
    else {
LAB_00519c7b:
      auVar10._4_4_ = fVar6;
      auVar10._0_4_ = fVar5;
      auVar10._8_4_ = fVar7;
      auVar10._12_4_ = fVar8;
    }
    *(undefined1 (*) [16])(dest + uVar4 + (long)index * 0x10) = auVar10;
    uVar4 = uVar4 + 0x10;
  } while( true );
}

Assistant:

void QT_FASTCALL storeRGBA32FFromRGBA32F_sse4(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgbaFloat32 *d = reinterpret_cast<QRgbaFloat32 *>(dest) + index;
    const __m128 zero = _mm_set1_ps(0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_load_ps(reinterpret_cast<const float *>(src + i));
        const __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsr = _mm_insert_ps(vsr, _mm_set_ss(1.0f), 0x30);
            vsf = _mm_mul_ps(vsf, vsr);
        }
        _mm_store_ps(reinterpret_cast<float *>(d + i), vsf);
    }
}